

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_update_rates
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  opj_image_t *poVar1;
  uint uVar2;
  int iVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  OPJ_INT32 OVar6;
  OPJ_INT32 OVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  OPJ_OFF_T OVar10;
  OPJ_UINT32 *pOVar11;
  OPJ_BYTE *pOVar12;
  float fVar13;
  float fVar14;
  code *pcStack_90;
  OPJ_FLOAT32 l_offset;
  _func_OPJ_FLOAT32_opj_tcp_t_ptr *l_tp_stride_func;
  uint local_80;
  OPJ_UINT32 l_last_res;
  OPJ_UINT32 l_tile_size;
  OPJ_UINT32 l_size_pixel;
  OPJ_UINT32 l_bits_empty;
  OPJ_FLOAT32 l_sot_remove;
  OPJ_FLOAT32 *l_rates;
  OPJ_INT32 l_y1;
  OPJ_INT32 l_x1;
  OPJ_INT32 l_y0;
  OPJ_INT32 l_x0;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  opj_image_comp_t *l_img_comp;
  opj_tcp_t *l_tcp;
  opj_image_t *l_image;
  opj_cp_t *l_cp;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x13be,
                  "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream == (opj_stream_private_t *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0x13c0,
                    "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    poVar1 = p_j2k->m_private_image;
    l_img_comp = (opj_image_comp_t *)(p_j2k->m_cp).tcps;
    uVar2 = poVar1->comps->dx * poVar1->comps->dy * 8;
    iVar3 = poVar1->numcomps * poVar1->comps->prec;
    OVar10 = opj_stream_tell(p_stream);
    fVar13 = (float)OVar10 / (float)((p_j2k->m_cp).th * (p_j2k->m_cp).tw);
    if ((*(byte *)((long)&(p_j2k->m_cp).m_specific_param + 0x11) >> 3 & 1) == 0) {
      pcStack_90 = opj_j2k_get_default_stride;
    }
    else {
      pcStack_90 = opj_j2k_get_tp_stride;
    }
    for (k = 0; k < (p_j2k->m_cp).th; k = k + 1) {
      for (l_x0 = 0; (uint)l_x0 < (p_j2k->m_cp).tw; l_x0 = l_x0 + 1) {
        fVar14 = (float)(*pcStack_90)(l_img_comp);
        fVar14 = fVar14 / (float)l_img_comp->w;
        OVar4 = opj_int_max((p_j2k->m_cp).tx0 + l_x0 * (p_j2k->m_cp).tdx,poVar1->x0);
        OVar5 = opj_int_max((p_j2k->m_cp).ty0 + k * (p_j2k->m_cp).tdy,poVar1->y0);
        OVar6 = opj_int_min((p_j2k->m_cp).tx0 + (l_x0 + 1) * (p_j2k->m_cp).tdx,poVar1->x1);
        OVar7 = opj_int_min((p_j2k->m_cp).ty0 + (k + 1) * (p_j2k->m_cp).tdy,poVar1->y1);
        pOVar11 = &l_img_comp->y0;
        if (0.0 < (float)*pOVar11) {
          *pOVar11 = (OPJ_UINT32)
                     ((float)(uint)(iVar3 * (OVar6 - OVar4) * (OVar7 - OVar5)) /
                      ((float)*pOVar11 * (float)uVar2) - fVar14);
        }
        _l_bits_empty = &l_img_comp->prec;
        for (l_y0 = 1; (uint)l_y0 < l_img_comp->w; l_y0 = l_y0 + 1) {
          if (0.0 < (float)*_l_bits_empty) {
            *_l_bits_empty =
                 (OPJ_UINT32)
                 ((float)(uint)(iVar3 * (OVar6 - OVar4) * (OVar7 - OVar5)) /
                  ((float)*_l_bits_empty * (float)uVar2) - fVar14);
          }
          _l_bits_empty = _l_bits_empty + 1;
        }
        l_img_comp = l_img_comp + 0x59;
      }
    }
    l_img_comp = (opj_image_comp_t *)(p_j2k->m_cp).tcps;
    for (k = 0; k < (p_j2k->m_cp).th; k = k + 1) {
      for (l_x0 = 0; (uint)l_x0 < (p_j2k->m_cp).tw; l_x0 = l_x0 + 1) {
        pOVar11 = &l_img_comp->y0;
        if ((0.0 < (float)*pOVar11) &&
           (*pOVar11 = (OPJ_UINT32)((float)*pOVar11 - fVar13),
           (float)*pOVar11 <= 30.0 && (float)*pOVar11 != 30.0)) {
          *pOVar11 = 0x41f00000;
        }
        _l_bits_empty = &l_img_comp->prec;
        OVar8 = l_img_comp->w;
        for (l_y0 = 1; (uint)l_y0 < OVar8 - 1; l_y0 = l_y0 + 1) {
          if ((0.0 < (float)*_l_bits_empty) &&
             (*_l_bits_empty = (OPJ_UINT32)((float)*_l_bits_empty - fVar13),
             (float)*_l_bits_empty < (float)_l_bits_empty[-1] + 10.0)) {
            *_l_bits_empty = (OPJ_UINT32)((float)_l_bits_empty[-1] + 20.0);
          }
          _l_bits_empty = _l_bits_empty + 1;
        }
        if ((0.0 < (float)*_l_bits_empty) &&
           (*_l_bits_empty = (OPJ_UINT32)((float)*_l_bits_empty - (fVar13 + 2.0)),
           (float)*_l_bits_empty < (float)_l_bits_empty[-1] + 10.0)) {
          *_l_bits_empty = (OPJ_UINT32)((float)_l_bits_empty[-1] + 20.0);
        }
        l_img_comp = l_img_comp + 0x59;
      }
    }
    _j = poVar1->comps;
    local_80 = 0;
    for (k = 0; k < poVar1->numcomps; k = k + 1) {
      OVar8 = opj_uint_ceildiv((p_j2k->m_cp).tdx,_j->dx);
      OVar9 = opj_uint_ceildiv((p_j2k->m_cp).tdy,_j->dy);
      local_80 = OVar8 * OVar9 * _j->prec + local_80;
      _j = _j + 1;
    }
    OVar8 = opj_j2k_get_specific_header_sizes(p_j2k);
    (p_j2k->m_specific_param).m_decoder.m_tile_ind_to_dec =
         OVar8 + (int)(long)((double)local_80 * 1.4 * 0.125) + 500;
    pOVar12 = (OPJ_BYTE *)opj_malloc((ulong)(p_j2k->m_specific_param).m_encoder.m_encoded_tile_size)
    ;
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = pOVar12;
    if ((p_j2k->m_specific_param).m_encoder.m_encoded_tile_data == (OPJ_BYTE *)0x0) {
      p_j2k_local._4_4_ = 0;
    }
    else {
      if ((2 < (p_j2k->m_cp).rsiz) && ((p_j2k->m_cp).rsiz < 7)) {
        pOVar12 = (OPJ_BYTE *)
                  opj_malloc((ulong)((p_j2k->m_specific_param).m_decoder.m_start_tile_x * 5));
        (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar12;
        if ((p_j2k->m_specific_param).m_decoder.m_header_data == (OPJ_BYTE *)0x0) {
          return 0;
        }
        (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current =
             (p_j2k->m_specific_param).m_decoder.m_header_data;
      }
      p_j2k_local._4_4_ = 1;
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x13bf,
                "OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_update_rates(opj_j2k_t *p_j2k,
                                     opj_stream_private_t *p_stream,
                                     opj_event_mgr_t * p_manager)
{
    opj_cp_t * l_cp = 00;
    opj_image_t * l_image = 00;
    opj_tcp_t * l_tcp = 00;
    opj_image_comp_t * l_img_comp = 00;

    OPJ_UINT32 i, j, k;
    OPJ_INT32 l_x0, l_y0, l_x1, l_y1;
    OPJ_FLOAT32 * l_rates = 0;
    OPJ_FLOAT32 l_sot_remove;
    OPJ_UINT32 l_bits_empty, l_size_pixel;
    OPJ_UINT32 l_tile_size = 0;
    OPJ_UINT32 l_last_res;
    OPJ_FLOAT32(* l_tp_stride_func)(opj_tcp_t *) = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    OPJ_UNUSED(p_manager);

    l_cp = &(p_j2k->m_cp);
    l_image = p_j2k->m_private_image;
    l_tcp = l_cp->tcps;

    l_bits_empty = 8 * l_image->comps->dx * l_image->comps->dy;
    l_size_pixel = l_image->numcomps * l_image->comps->prec;
    l_sot_remove = (OPJ_FLOAT32) opj_stream_tell(p_stream) / (OPJ_FLOAT32)(
                       l_cp->th * l_cp->tw);

    if (l_cp->m_specific_param.m_enc.m_tp_on) {
        l_tp_stride_func = opj_j2k_get_tp_stride;
    } else {
        l_tp_stride_func = opj_j2k_get_default_stride;
    }

    for (i = 0; i < l_cp->th; ++i) {
        for (j = 0; j < l_cp->tw; ++j) {
            OPJ_FLOAT32 l_offset = (OPJ_FLOAT32)(*l_tp_stride_func)(l_tcp) /
                                   (OPJ_FLOAT32)l_tcp->numlayers;

            /* 4 borders of the tile rescale on the image if necessary */
            l_x0 = opj_int_max((OPJ_INT32)(l_cp->tx0 + j * l_cp->tdx),
                               (OPJ_INT32)l_image->x0);
            l_y0 = opj_int_max((OPJ_INT32)(l_cp->ty0 + i * l_cp->tdy),
                               (OPJ_INT32)l_image->y0);
            l_x1 = opj_int_min((OPJ_INT32)(l_cp->tx0 + (j + 1) * l_cp->tdx),
                               (OPJ_INT32)l_image->x1);
            l_y1 = opj_int_min((OPJ_INT32)(l_cp->ty0 + (i + 1) * l_cp->tdy),
                               (OPJ_INT32)l_image->y1);

            l_rates = l_tcp->rates;

            /* Modification of the RATE >> */
            if (*l_rates > 0.0f) {
                *l_rates = (((OPJ_FLOAT32)(l_size_pixel * (OPJ_UINT32)(l_x1 - l_x0) *
                                           (OPJ_UINT32)(l_y1 - l_y0)))
                            /
                            ((*l_rates) * (OPJ_FLOAT32)l_bits_empty)
                           )
                           -
                           l_offset;
            }

            ++l_rates;

            for (k = 1; k < l_tcp->numlayers; ++k) {
                if (*l_rates > 0.0f) {
                    *l_rates = (((OPJ_FLOAT32)(l_size_pixel * (OPJ_UINT32)(l_x1 - l_x0) *
                                               (OPJ_UINT32)(l_y1 - l_y0)))
                                /
                                ((*l_rates) * (OPJ_FLOAT32)l_bits_empty)
                               )
                               -
                               l_offset;
                }

                ++l_rates;
            }

            ++l_tcp;

        }
    }

    l_tcp = l_cp->tcps;

    for (i = 0; i < l_cp->th; ++i) {
        for (j = 0; j < l_cp->tw; ++j) {
            l_rates = l_tcp->rates;

            if (*l_rates > 0.0f) {
                *l_rates -= l_sot_remove;

                if (*l_rates < 30.0f) {
                    *l_rates = 30.0f;
                }
            }

            ++l_rates;

            l_last_res = l_tcp->numlayers - 1;

            for (k = 1; k < l_last_res; ++k) {

                if (*l_rates > 0.0f) {
                    *l_rates -= l_sot_remove;

                    if (*l_rates < * (l_rates - 1) + 10.0f) {
                        *l_rates  = (*(l_rates - 1)) + 20.0f;
                    }
                }

                ++l_rates;
            }

            if (*l_rates > 0.0f) {
                *l_rates -= (l_sot_remove + 2.f);

                if (*l_rates < * (l_rates - 1) + 10.0f) {
                    *l_rates  = (*(l_rates - 1)) + 20.0f;
                }
            }

            ++l_tcp;
        }
    }

    l_img_comp = l_image->comps;
    l_tile_size = 0;

    for (i = 0; i < l_image->numcomps; ++i) {
        l_tile_size += (opj_uint_ceildiv(l_cp->tdx, l_img_comp->dx)
                        *
                        opj_uint_ceildiv(l_cp->tdy, l_img_comp->dy)
                        *
                        l_img_comp->prec
                       );

        ++l_img_comp;
    }

    /* TODO: where does this magic value come from ? */
    /* This used to be 1.3 / 8, but with random data and very small code */
    /* block sizes, this is not enough. For example with */
    /* bin/test_tile_encoder 1 256 256 32 32 8 0 reversible_with_precinct.j2k 4 4 3 0 0 1 16 16 */
    /* TODO revise this to take into account the overhead linked to the */
    /* number of packets and number of code blocks in packets */
    l_tile_size = (OPJ_UINT32)(l_tile_size * 1.4 / 8);

    /* Arbitrary amount to make the following work: */
    /* bin/test_tile_encoder 1 256 256 17 16 8 0 reversible_no_precinct.j2k 4 4 3 0 0 1 */
    l_tile_size += 500;

    l_tile_size += opj_j2k_get_specific_header_sizes(p_j2k);

    p_j2k->m_specific_param.m_encoder.m_encoded_tile_size = l_tile_size;
    p_j2k->m_specific_param.m_encoder.m_encoded_tile_data =
        (OPJ_BYTE *) opj_malloc(p_j2k->m_specific_param.m_encoder.m_encoded_tile_size);
    if (p_j2k->m_specific_param.m_encoder.m_encoded_tile_data == 00) {
        return OPJ_FALSE;
    }

    if (OPJ_IS_CINEMA(l_cp->rsiz)) {
        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer =
            (OPJ_BYTE *) opj_malloc(5 *
                                    p_j2k->m_specific_param.m_encoder.m_total_tile_parts);
        if (! p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer) {
            return OPJ_FALSE;
        }

        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current =
            p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer;
    }

    return OPJ_TRUE;
}